

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangecontrols.cpp
# Opt level: O1

void __thiscall QAccessibleSpinBox::QAccessibleSpinBox(QAccessibleSpinBox *this,QWidget *w)

{
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QString local_58;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QAccessibleAbstractSpinBox::QAccessibleAbstractSpinBox(&this->super_QAccessibleAbstractSpinBox,w);
  *(undefined ***)&(this->super_QAccessibleAbstractSpinBox).super_QAccessibleWidget =
       &PTR__QAccessibleAbstractSpinBox_00817288;
  *(undefined ***)
   &(this->super_QAccessibleAbstractSpinBox).super_QAccessibleWidget.
    super_QAccessibleActionInterface = &PTR__QAccessibleSpinBox_00817418;
  *(undefined ***)&(this->super_QAccessibleAbstractSpinBox).super_QAccessibleValueInterface =
       &PTR__QAccessibleSpinBox_00817460;
  *(undefined ***)&(this->super_QAccessibleAbstractSpinBox).super_QAccessibleTextInterface =
       &PTR__QAccessibleSpinBox_008174a8;
  *(undefined ***)&(this->super_QAccessibleAbstractSpinBox).super_QAccessibleEditableTextInterface =
       &PTR__QAccessibleSpinBox_00817548;
  QVar1.m_data = (storage_type *)0x11;
  QVar1.m_size = (qsizetype)&local_38;
  QString::fromLatin1(QVar1);
  local_58.d.d = (Data *)local_38;
  local_58.d.ptr = pcStack_30;
  local_58.d.size = local_28;
  QAccessibleWidget::addControllingSignal((QAccessibleWidget *)this,&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleSpinBox::QAccessibleSpinBox(QWidget *w)
: QAccessibleAbstractSpinBox(w)
{
    Q_ASSERT(spinBox());
    addControllingSignal("valueChanged(int)"_L1);
}